

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O3

int luaD_pretailcall(lua_State *L,CallInfo *ci,StkId func,int narg1,int delta)

{
  byte *pbVar1;
  byte bVar2;
  long lVar3;
  byte bVar4;
  uint status;
  int nres;
  StkId pSVar5;
  CallInfo *ci_00;
  ulong uVar6;
  lua_CFunction p_Var7;
  undefined1 *puVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  
  uVar10 = (ulong)narg1;
  uVar6 = uVar10 << 4 | 8;
  status = 0;
  while( true ) {
    bVar4 = (func->val).tt_ & 0x3f;
    if (bVar4 == 6) {
      lVar11 = *(long *)((func->val).value_.f + 0x18);
      bVar4 = *(byte *)(lVar11 + 0xc);
      bVar2 = *(byte *)(lVar11 + 10);
      lVar9 = (ulong)bVar4 - (long)delta;
      if ((long)(L->stack_last).p - (L->top).offset >> 4 <= lVar9) {
        lVar3 = (L->stack).offset;
        luaD_growstack(L,(int)lVar9,1);
        func = (StkId)(((long)func - lVar3) + (long)(L->stack).p);
      }
      pSVar5 = (ci->func).p + -(long)delta;
      (ci->func).p = pSVar5;
      if (0 < (int)uVar10) {
        lVar9 = 0;
        do {
          pSVar5 = (ci->func).p;
          *(undefined8 *)((long)pSVar5 + lVar9) = *(undefined8 *)((long)func + lVar9);
          *(undefined1 *)((long)pSVar5 + lVar9 + 8) = *(undefined1 *)((long)func + lVar9 + 8);
          lVar9 = lVar9 + 0x10;
        } while ((uVar10 & 0xffffffff) << 4 != lVar9);
        pSVar5 = (ci->func).p;
      }
      if ((int)uVar10 <= (int)(uint)bVar2) {
        lVar9 = uVar10 - 1;
        puVar8 = (undefined1 *)(uVar6 + (long)pSVar5);
        do {
          *puVar8 = 0;
          lVar9 = lVar9 + 1;
          puVar8 = puVar8 + 0x10;
          uVar10 = (ulong)((int)uVar10 + 1);
        } while (lVar9 < (long)(ulong)(uint)bVar2);
      }
      (ci->top).p = pSVar5 + (ulong)bVar4 + 1;
      (ci->u).l.savedpc = *(Instruction **)(lVar11 + 0x40);
      pbVar1 = (byte *)((long)&ci->callstatus + 2);
      *pbVar1 = *pbVar1 | 0x40;
      (L->top).p = pSVar5 + (uVar10 & 0xffffffff);
      return -1;
    }
    if (bVar4 == 0x16) break;
    if (bVar4 == 0x26) {
      p_Var7 = *(lua_CFunction *)((func->val).value_.f + 0x18);
      lVar11 = (L->top).offset;
      if ((long)(L->stack_last).p - lVar11 < 0x150) {
        lVar11 = (L->stack).offset;
        luaD_growstack(L,0x14,1);
        func = (StkId)(((long)func - lVar11) + (long)(L->stack).p);
        lVar11 = (L->top).offset;
      }
      ci_00 = L->ci->next;
      if (ci_00 == (CallInfo *)0x0) {
        ci_00 = luaE_extendCI(L);
      }
      (ci_00->func).p = func;
      ci_00->callstatus = status | 0x8000;
      (ci_00->top).p = (StkId)(lVar11 + 0x140);
      L->ci = ci_00;
      if ((L->hookmask & 1U) != 0) {
        luaD_pretailcall_cold_2();
      }
      goto LAB_0010c53b;
    }
    if ((long)(L->stack_last).p - (L->top).offset < 0x11) {
      lVar11 = (L->stack).offset;
      luaD_growstack(L,1,1);
      func = (StkId)(((long)func - lVar11) + (long)(L->stack).p);
    }
    status = tryfuncTM(L,func,status);
    uVar10 = uVar10 + 1;
    uVar6 = uVar6 + 0x10;
  }
  p_Var7 = (func->val).value_.f;
  lVar11 = (L->top).offset;
  if ((long)(L->stack_last).p - lVar11 < 0x150) {
    lVar11 = (L->stack).offset;
    luaD_growstack(L,0x14,1);
    func = (StkId)(((long)func - lVar11) + (long)(L->stack).p);
    lVar11 = (L->top).offset;
  }
  ci_00 = L->ci->next;
  if (ci_00 == (CallInfo *)0x0) {
    ci_00 = luaE_extendCI(L);
  }
  (ci_00->func).p = func;
  ci_00->callstatus = status | 0x8000;
  (ci_00->top).p = (StkId)(lVar11 + 0x140);
  L->ci = ci_00;
  if ((L->hookmask & 1U) != 0) {
    luaD_pretailcall_cold_1();
  }
LAB_0010c53b:
  nres = (*p_Var7)(L);
  luaD_poscall(L,ci_00,nres);
  return nres;
}

Assistant:

int luaD_pretailcall (lua_State *L, CallInfo *ci, StkId func,
                                    int narg1, int delta) {
  unsigned status = LUA_MULTRET + 1;
 retry:
  switch (ttypetag(s2v(func))) {
    case LUA_VCCL:  /* C closure */
      return precallC(L, func, status, clCvalue(s2v(func))->f);
    case LUA_VLCF:  /* light C function */
      return precallC(L, func, status, fvalue(s2v(func)));
    case LUA_VLCL: {  /* Lua function */
      Proto *p = clLvalue(s2v(func))->p;
      int fsize = p->maxstacksize;  /* frame size */
      int nfixparams = p->numparams;
      int i;
      checkstackp(L, fsize - delta, func);
      ci->func.p -= delta;  /* restore 'func' (if vararg) */
      for (i = 0; i < narg1; i++)  /* move down function and arguments */
        setobjs2s(L, ci->func.p + i, func + i);
      func = ci->func.p;  /* moved-down function */
      for (; narg1 <= nfixparams; narg1++)
        setnilvalue(s2v(func + narg1));  /* complete missing arguments */
      ci->top.p = func + 1 + fsize;  /* top for new function */
      lua_assert(ci->top.p <= L->stack_last.p);
      ci->u.l.savedpc = p->code;  /* starting point */
      ci->callstatus |= CIST_TAIL;
      L->top.p = func + narg1;  /* set top */
      return -1;
    }
    default: {  /* not a function */
      checkstackp(L, 1, func);  /* space for metamethod */
      status = tryfuncTM(L, func, status);  /* try '__call' metamethod */
      narg1++;
      goto retry;  /* try again */
    }
  }
}